

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_string_append_from_wcs(archive_string *as,wchar_t *w,size_t len)

{
  wchar_t wVar1;
  long lVar2;
  long lVar3;
  archive_string *paVar4;
  size_t sVar5;
  archive_string *paVar6;
  int *piVar7;
  long in_RDX;
  wchar_t *in_RSI;
  long *in_RDI;
  mbstate_t shift_state;
  char *end;
  char *p;
  wchar_t ret_val;
  wchar_t n;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  archive_string *in_stack_ffffffffffffffb8;
  mbstate_t local_40;
  char *local_38;
  char *local_30;
  wchar_t local_28;
  int local_24;
  long local_20;
  wchar_t *local_18;
  long *local_10;
  wchar_t local_4;
  
  local_28 = L'\0';
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_40,0,8);
  paVar4 = archive_string_ensure
                     (in_stack_ffffffffffffffb8,
                      CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  if (paVar4 == (archive_string *)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_30 = (char *)(*local_10 + local_10[1]);
    paVar4 = (archive_string *)(*local_10 + local_10[2]);
    sVar5 = __ctype_get_mb_cur_max();
    local_38 = (char *)((long)paVar4 + (-1 - sVar5));
    for (; wVar1 = *local_18, wVar1 != L'\0' && local_20 != 0; local_20 = local_20 + -1) {
      if (local_38 <= local_30) {
        local_10[1] = (long)local_30 - *local_10;
        *(undefined1 *)(*local_10 + local_10[1]) = 0;
        paVar6 = archive_string_ensure
                           (paVar4,CONCAT17(wVar1 != L'\0' && local_20 != 0,
                                            in_stack_ffffffffffffffb0));
        if (paVar6 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_30 = (char *)(*local_10 + local_10[1]);
        lVar2 = *local_10;
        lVar3 = local_10[2];
        sVar5 = __ctype_get_mb_cur_max();
        local_38 = (char *)(((lVar2 + lVar3) - sVar5) + -1);
      }
      wVar1 = *local_18;
      local_18 = local_18 + 1;
      sVar5 = wcrtomb(local_30,wVar1,&local_40);
      local_24 = (int)sVar5;
      if (local_24 == -1) {
        piVar7 = __errno_location();
        if (*piVar7 != 0x54) {
          local_28 = L'\xffffffff';
          break;
        }
        *local_30 = '?';
        local_28 = L'\xffffffff';
        local_30 = local_30 + 1;
      }
      else {
        local_30 = local_30 + local_24;
      }
    }
    local_10[1] = (long)local_30 - *local_10;
    *(undefined1 *)(*local_10 + local_10[1]) = 0;
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

int
archive_string_append_from_wcs(struct archive_string *as,
    const wchar_t *w, size_t len)
{
	/* We cannot use the standard wcstombs() here because it
	 * cannot tell us how big the output buffer should be.  So
	 * I've built a loop around wcrtomb() or wctomb() that
	 * converts a character at a time and resizes the string as
	 * needed.  We prefer wcrtomb() when it's available because
	 * it's thread-safe. */
	int n, ret_val = 0;
	char *p;
	char *end;
#if HAVE_WCRTOMB
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	wctomb(NULL, L'\0');
#endif
	/*
	 * Allocate buffer for MBS.
	 * We need this allocation here since it is possible that
	 * as->s is still NULL.
	 */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	p = as->s + as->length;
	end = as->s + as->buffer_length - MB_CUR_MAX -1;
	while (*w != L'\0' && len > 0) {
		if (p >= end) {
			as->length = p - as->s;
			as->s[as->length] = '\0';
			/* Re-allocate buffer for MBS. */
			if (archive_string_ensure(as,
			    as->length + len * 2 + 1) == NULL)
				return (-1);
			p = as->s + as->length;
			end = as->s + as->buffer_length - MB_CUR_MAX -1;
		}
#if HAVE_WCRTOMB
		n = wcrtomb(p, *w++, &shift_state);
#else
		n = wctomb(p, *w++);
#endif
		if (n == -1) {
			if (errno == EILSEQ) {
				/* Skip an illegal wide char. */
				*p++ = '?';
				ret_val = -1;
			} else {
				ret_val = -1;
				break;
			}
		} else
			p += n;
		len--;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret_val);
}